

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

int __thiscall QDate::dayOfYear(QDate *this,QCalendar cal)

{
  bool bVar1;
  qint64 qVar2;
  undefined8 in_RSI;
  QDate *in_RDI;
  long in_FS_OFFSET;
  QDate firstDay;
  QDate *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  undefined8 in_stack_ffffffffffffffd8;
  QCalendar *this_01;
  QCalendar cal_00;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  cal_00.d_ptr = *(QCalendarBackend **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = isValid((QDate *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    this_01 = (QCalendar *)&DAT_aaaaaaaaaaaaaaaa;
    year(in_RDI,cal_00);
    QCalendar::dateFromParts(this_01,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,iVar3);
    bVar1 = isValid((QDate *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (bVar1) {
      qVar2 = daysTo(this_00,(QDate)in_RDI->jd);
      iVar3 = (int)qVar2 + 1;
      goto LAB_00565da2;
    }
  }
  iVar3 = 0;
LAB_00565da2:
  if (*(QCalendarBackend **)(in_FS_OFFSET + 0x28) != cal_00.d_ptr) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

int QDate::dayOfYear(QCalendar cal) const
{
    if (isValid()) {
        QDate firstDay = cal.dateFromParts(year(cal), 1, 1);
        if (firstDay.isValid())
            return firstDay.daysTo(*this) + 1;
    }
    return 0;
}